

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void AnalyzeModuleImport(ExpressionContext *ctx,SynModuleImport *syntax)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ByteCode *bytecode;
  Lexeme *lexStream;
  uint uVar6;
  InplaceStr IVar7;
  uint lexStreamSize;
  TraceScope traceScope;
  uint local_64;
  char *local_60;
  SynModuleImport *local_58;
  InplaceStr local_50;
  TraceScope local_40;
  char *moduleName;
  char *pcVar5;
  
  IVar7 = GetModuleName(ctx->allocator,ctx->moduleRoot,syntax->path);
  pcVar5 = IVar7.end;
  moduleName = IVar7.begin;
  if (AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token == '\0') {
    iVar4 = __cxa_guard_acquire(&AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token);
    if (iVar4 != 0) {
      AnalyzeModuleImport::token = NULLC::TraceGetToken("analyze","AnalyzeModuleImport");
      __cxa_guard_release(&AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_40,AnalyzeModuleImport::token);
  lVar3 = NULLC::traceContext;
  iVar4 = (int)((long)pcVar5 - (long)moduleName);
  if (iVar4 != 0) {
    uVar6 = iVar4 + 1;
    local_60 = pcVar5;
    local_58 = syntax;
    if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar6) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
    }
    if (*(uint *)(lVar3 + 0x264) <= uVar6) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar1 = *(uint *)(lVar3 + 0x260);
    memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),moduleName,
           (long)pcVar5 - (long)moduleName & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar3 + 0x268) + (ulong)(uint)(*(int *)(lVar3 + 0x260) + iVar4)) = 0;
    *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar6;
    lVar2 = *(long *)(lVar3 + 0x278);
    uVar6 = *(uint *)(lVar3 + 0x270);
    *(uint *)(lVar3 + 0x270) = uVar6 + 1;
    *(uint *)(lVar2 + (ulong)uVar6 * 8) = uVar1 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar6 * 8) = 0;
    syntax = local_58;
    pcVar5 = local_60;
  }
  IVar7.end = pcVar5;
  IVar7.begin = moduleName;
  bytecode = (ByteCode *)BinaryCache::FindBytecode(moduleName,false);
  if (bytecode == (ByteCode *)0x0) {
    IVar7 = GetModuleName(ctx->allocator,(char *)0x0,syntax->path);
    bytecode = (ByteCode *)BinaryCache::FindBytecode(IVar7.begin,false);
  }
  local_64 = 0;
  lexStream = BinaryCache::FindLexems(IVar7.begin,false,&local_64);
  if (bytecode != (ByteCode *)0x0) {
    local_50 = IVar7;
    ImportModule(ctx,&syntax->super_SynBase,bytecode,lexStream,local_64,IVar7);
    NULLC::TraceScope::~TraceScope(&local_40);
    return;
  }
  anon_unknown.dwarf_11255e::Stop
            (ctx,&syntax->super_SynBase,"ERROR: module import is not implemented");
}

Assistant:

void AnalyzeModuleImport(ExpressionContext &ctx, SynModuleImport *syntax)
{
	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, syntax->path);

	TRACE_SCOPE("analyze", "AnalyzeModuleImport");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, syntax->path);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	unsigned lexStreamSize = 0;
	Lexeme *lexStream = BinaryCache::FindLexems(moduleName.begin, false, lexStreamSize);

	if(!bytecode)
		Stop(ctx, syntax, "ERROR: module import is not implemented");

	ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, moduleName);
}